

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
tinyusdz::GeomPrimvar::get_indices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GeomPrimvar *this,double t)

{
  bool bVar1;
  
  if ((!NAN(t)) ||
     ((this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish)) {
    bVar1 = has_timesampled_indices(this);
    if (bVar1) {
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
              get<std::vector<int,_std::allocator<int>_>,_nullptr>
                        (&this->_ts_indices,__return_storage_ptr__,t,Linear);
      if (bVar1) {
        return __return_storage_ptr__;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>);
    }
    if ((this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,&this->_indices);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> GeomPrimvar::get_indices(const double t) const {
  if (value::TimeCode(t).is_default()) {
    if (has_default_indices()) {
      return get_default_indices();
    }
  }
  
  if (has_timesampled_indices()) {
    std::vector<int32_t> indices;
    if (get_timesampled_indices().get(&indices, t)) {
      return indices;
    }
  }

  if (has_default_indices()) {
    return get_default_indices();
  }

  return std::vector<int32_t>();
}